

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::on_tracker_announce(torrent *this,error_code *ec)

{
  bool bVar1;
  error_code *ec_local;
  torrent *this_local;
  
  this->m_waiting_tracker = this->m_waiting_tracker + -1;
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if ((!bVar1) && ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0)) {
    announce_with_tracker(this,none);
  }
  return;
}

Assistant:

void torrent::on_tracker_announce(error_code const& ec) try
	{
		COMPLETE_ASYNC("tracker::on_tracker_announce");
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(m_waiting_tracker > 0);
		--m_waiting_tracker;
		if (ec) return;
		if (m_abort) return;
		announce_with_tracker();
	}
	catch (...) { handle_exception(); }